

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::GetNumElConnected(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                    *this,TPZVec<int> *numelconnected)

{
  TPZConnect *pTVar1;
  long lVar2;
  int64_t size;
  long nelem;
  int64_t ind;
  long minindex;
  long lVar3;
  TPZManVector<long,_10> destindex;
  TPZManVector<long,_10> firstind;
  
  (**(code **)(**(long **)&this->field_0x8 + 0x78))();
  nelem = 0;
  do {
    if (*(long *)(*(long *)&this->field_0x8 + 0x160) <= nelem) {
      return;
    }
    pTVar1 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)(*(long *)&this->field_0x8 + 0x158),nelem)
    ;
    if (((pTVar1->fDependList == (TPZDepend *)0x0) &&
        ((pTVar1->field_2).fCompose.fIsCondensed == false)) && (-1 < pTVar1->fSequenceNumber)) {
      lVar3 = *(long *)(*(long *)&this->field_0x8 + 0x5f0);
      lVar2 = (long)(int)pTVar1->fSequenceNumber * 0x10;
      minindex = (long)*(int *)(lVar3 + 8 + lVar2);
      lVar3 = (long)*(int *)(lVar3 + 0xc + lVar2);
      size = TPZEquationFilter::NumActive
                       ((TPZEquationFilter *)&this->field_0x48,minindex,lVar3 + minindex);
      if (size != 0) {
        if (size != lVar3) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
                     ,0x27);
        }
        TPZManVector<long,_10>::TPZManVector(&firstind,size);
        TPZManVector<long,_10>::TPZManVector(&destindex,size);
        if (size < 1) {
          size = 0;
        }
        for (lVar3 = 0; size != lVar3; lVar3 = lVar3 + 1) {
          firstind.super_TPZVec<long>.fStore[lVar3] = lVar3;
          destindex.super_TPZVec<long>.fStore[lVar3] = minindex + lVar3;
        }
        TPZEquationFilter::Filter
                  ((TPZEquationFilter *)&this->field_0x48,&firstind.super_TPZVec<long>,
                   &destindex.super_TPZVec<long>);
        for (lVar3 = 0; lVar3 < destindex.super_TPZVec<long>.fNElements; lVar3 = lVar3 + 1) {
          pTVar1 = TPZChunkVector<TPZConnect,_10>::operator[]
                             ((TPZChunkVector<TPZConnect,_10> *)(*(long *)&this->field_0x8 + 0x158),
                              nelem);
          numelconnected->fStore[destindex.super_TPZVec<long>.fStore[lVar3]] = pTVar1->fNElConnected
          ;
        }
        TPZManVector<long,_10>::~TPZManVector(&destindex);
        TPZManVector<long,_10>::~TPZManVector(&firstind);
      }
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::GetNumElConnected(TPZVec <int> &numelconnected){
	int64_t ic;
	
	this->fMesh->ComputeNodElCon();
	
	for(ic=0; ic<this->fMesh->ConnectVec().NElements(); ic++) {
		TPZConnect &cn = this->fMesh->ConnectVec()[ic];
		if(cn.HasDependency() || cn.IsCondensed()) continue;
		int64_t seqn = cn.SequenceNumber();
		if(seqn < 0) continue;
		int64_t firsteq = this->fMesh->Block().Position(seqn);
		int64_t lasteq = firsteq+this->fMesh->Block().Size(seqn);
        int64_t numactive = this->fEquationFilter.NumActive(firsteq, lasteq);
		if(!numactive) continue;
        if (numactive != lasteq-firsteq) {
            DebugStop();
        }
        TPZManVector<int64_t> firstind(numactive),destindex(numactive);
        for (int64_t i = 0; i<numactive; i++) {
            firstind[i] = i;
            destindex[i] = firsteq+i;
        }
        this->fEquationFilter.Filter(firstind, destindex);
		for(int64_t ind=0;ind<destindex.size();ind++) 
			numelconnected[destindex[ind] ] = this->fMesh->ConnectVec()[ic].NElConnected();
	}
}